

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

opStatus __thiscall
llvm::detail::DoubleAPFloat::convertFromAPInt
          (DoubleAPFloat *this,APInt *Input,bool IsSigned,roundingMode RM)

{
  opStatus oVar1;
  APFloat Tmp;
  DoubleAPFloat DStack_68;
  APInt local_58;
  APFloat local_48;
  
  if (this->Semantics == (fltSemantics *)semPPCDoubleDouble) {
    IEEEFloat::IEEEFloat(&local_48.U.IEEE,(fltSemantics *)semPPCDoubleDoubleLegacy);
    oVar1 = APFloat::convertFromAPInt(&local_48,Input,IsSigned,RM);
    APFloat::bitcastToAPInt((APFloat *)&local_58);
    DoubleAPFloat(&DStack_68,(fltSemantics *)semPPCDoubleDouble,&local_58);
    operator=(this,&DStack_68);
    std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::~unique_ptr
              (&DStack_68.Floats);
    APInt::~APInt(&local_58);
    APFloat::Storage::~Storage((Storage *)&local_48.U.IEEE);
    return oVar1;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x10d7,
                "APFloat::opStatus llvm::detail::DoubleAPFloat::convertFromAPInt(const APInt &, bool, roundingMode)"
               );
}

Assistant:

APFloat::opStatus DoubleAPFloat::convertFromAPInt(const APInt &Input,
                                                  bool IsSigned,
                                                  roundingMode RM) {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  APFloat Tmp(semPPCDoubleDoubleLegacy);
  auto Ret = Tmp.convertFromAPInt(Input, IsSigned, RM);
  *this = DoubleAPFloat(semPPCDoubleDouble, Tmp.bitcastToAPInt());
  return Ret;
}